

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode DecodeRemaining(WebPIDecoder *idec)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  VP8StatusCode VVar5;
  size_t sVar6;
  WebPWorkerInterface *pWVar7;
  undefined4 *in_RDI;
  MBContext context;
  VP8BitReader *token_br;
  VP8Io *io;
  VP8Decoder *dec;
  undefined4 in_stack_ffffffffffffff98;
  VP8StatusCode in_stack_ffffffffffffff9c;
  VP8Decoder *in_stack_ffffffffffffffa0;
  WebPIDecoder *in_stack_ffffffffffffffa8;
  VP8Io *in_stack_ffffffffffffffc8;
  VP8Decoder *in_stack_ffffffffffffffd0;
  VP8StatusCode local_4;
  
  lVar3 = *(long *)(in_RDI + 0x20);
  if (*(int *)(lVar3 + 4) == 0) {
    local_4 = IDecError((WebPIDecoder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  }
  else {
    while (*(int *)(lVar3 + 0xb5c) < *(int *)(lVar3 + 0x19c)) {
      if (in_RDI[0x7a] != *(int *)(lVar3 + 0xb5c)) {
        iVar4 = VP8ParseIntraModeRow
                          ((VP8BitReader *)in_stack_ffffffffffffffa0,
                           (VP8Decoder *)
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if (iVar4 == 0) {
          VVar5 = IDecError((WebPIDecoder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          return VVar5;
        }
        in_RDI[0x7a] = *(undefined4 *)(lVar3 + 0xb5c);
      }
      while (*(int *)(lVar3 + 0xb58) < *(int *)(lVar3 + 0x198)) {
        uVar1 = *(uint *)(lVar3 + 0xb5c);
        uVar2 = *(uint *)(lVar3 + 0x1b0);
        SaveContext(in_stack_ffffffffffffffa0,
                    (VP8BitReader *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                    (MBContext *)0x10efaa);
        iVar4 = VP8DecodeMB(in_stack_ffffffffffffffd0,(VP8BitReader *)in_stack_ffffffffffffffc8);
        if (iVar4 == 0) {
          if ((*(int *)(lVar3 + 0x1b0) == 0) &&
             (sVar6 = MemDataSize((MemBuffer_conflict *)(in_RDI + 0x4a)), 0x1000 < sVar6)) {
            VVar5 = IDecError((WebPIDecoder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
            return VVar5;
          }
          if (0 < *(int *)(lVar3 + 200)) {
            pWVar7 = WebPGetWorkerInterface();
            iVar4 = (*pWVar7->Sync)((WebPWorker *)(lVar3 + 0x98));
            if (iVar4 == 0) {
              VVar5 = IDecError((WebPIDecoder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c)
              ;
              return VVar5;
            }
          }
          RestoreContext((MBContext *)in_stack_ffffffffffffffa0,
                         (VP8Decoder *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
                         ,(VP8BitReader *)0x10f059);
          return VP8_STATUS_SUSPENDED;
        }
        if (*(int *)(lVar3 + 0x1b0) == 0) {
          *(long *)(in_RDI + 0x4c) =
               *(long *)(lVar3 + (ulong)(uVar1 & uVar2) * 0x30 + 0x1c8) - *(long *)(in_RDI + 0x52);
        }
        *(int *)(lVar3 + 0xb58) = *(int *)(lVar3 + 0xb58) + 1;
      }
      VP8InitScanline(in_stack_ffffffffffffffa0);
      iVar4 = VP8ProcessRow(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      if (iVar4 == 0) {
        VVar5 = IDecError((WebPIDecoder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
        return VVar5;
      }
      *(int *)(lVar3 + 0xb5c) = *(int *)(lVar3 + 0xb5c) + 1;
    }
    iVar4 = VP8ExitCritical(in_stack_ffffffffffffffa0,
                            (VP8Io *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (iVar4 == 0) {
      *in_RDI = 7;
      local_4 = IDecError((WebPIDecoder *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    }
    else {
      *(undefined4 *)(lVar3 + 4) = 0;
      local_4 = FinishDecoding(in_stack_ffffffffffffffa8);
    }
  }
  return local_4;
}

Assistant:

static VP8StatusCode DecodeRemaining(WebPIDecoder* const idec) {
  VP8Decoder* const dec = (VP8Decoder*)idec->dec_;
  VP8Io* const io = &idec->io_;

  // Make sure partition #0 has been read before, to set dec to ready_.
  if (!dec->ready_) {
    return IDecError(idec, VP8_STATUS_BITSTREAM_ERROR);
  }
  for (; dec->mb_y_ < dec->mb_h_; ++dec->mb_y_) {
    if (idec->last_mb_y_ != dec->mb_y_) {
      if (!VP8ParseIntraModeRow(&dec->br_, dec)) {
        // note: normally, error shouldn't occur since we already have the whole
        // partition0 available here in DecodeRemaining(). Reaching EOF while
        // reading intra modes really means a BITSTREAM_ERROR.
        return IDecError(idec, VP8_STATUS_BITSTREAM_ERROR);
      }
      idec->last_mb_y_ = dec->mb_y_;
    }
    for (; dec->mb_x_ < dec->mb_w_; ++dec->mb_x_) {
      VP8BitReader* const token_br =
          &dec->parts_[dec->mb_y_ & dec->num_parts_minus_one_];
      MBContext context;
      SaveContext(dec, token_br, &context);
      if (!VP8DecodeMB(dec, token_br)) {
        // We shouldn't fail when MAX_MB data was available
        if (dec->num_parts_minus_one_ == 0 &&
            MemDataSize(&idec->mem_) > MAX_MB_SIZE) {
          return IDecError(idec, VP8_STATUS_BITSTREAM_ERROR);
        }
        // Synchronize the threads.
        if (dec->mt_method_ > 0) {
          if (!WebPGetWorkerInterface()->Sync(&dec->worker_)) {
            return IDecError(idec, VP8_STATUS_BITSTREAM_ERROR);
          }
        }
        RestoreContext(&context, dec, token_br);
        return VP8_STATUS_SUSPENDED;
      }
      // Release buffer only if there is only one partition
      if (dec->num_parts_minus_one_ == 0) {
        idec->mem_.start_ = token_br->buf_ - idec->mem_.buf_;
        assert(idec->mem_.start_ <= idec->mem_.end_);
      }
    }
    VP8InitScanline(dec);   // Prepare for next scanline

    // Reconstruct, filter and emit the row.
    if (!VP8ProcessRow(dec, io)) {
      return IDecError(idec, VP8_STATUS_USER_ABORT);
    }
  }
  // Synchronize the thread and check for errors.
  if (!VP8ExitCritical(dec, io)) {
    idec->state_ = STATE_ERROR;  // prevent re-entry in IDecError
    return IDecError(idec, VP8_STATUS_USER_ABORT);
  }
  dec->ready_ = 0;
  return FinishDecoding(idec);
}